

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgPort.c
# Opt level: O2

uint zvgEcpPutMem(uchar *mem,uint memSize)

{
  uint uVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if (memSize == (uint)lVar2) {
      return 0;
    }
    uVar1 = zvgEcpPutc(mem[lVar2]);
    lVar2 = lVar2 + 1;
  } while (uVar1 == 0);
  return uVar1;
}

Assistant:

uint zvgEcpPutMem( uchar *mem, uint memSize)
{
	uint	err;

	err = errOk;

	while (memSize-- > 0)
	{
		err = zvgEcpPutc( *mem);

		if (err)
			break;

		else
			mem++;
	}
	return (err);
}